

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

vector<soul::Type,_std::allocator<soul::Type>_> * __thiscall
soul::heart::Parser::readEventTypeList
          (vector<soul::Type,_std::allocator<soul::Type>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  Type TStack_38;
  
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2af3de);
  if (bVar1) {
    do {
      readValueType(&TStack_38,this);
      std::vector<soul::Type,_std::allocator<soul::Type>_>::emplace_back<soul::Type>
                (__return_storage_ptr__,&TStack_38);
      RefCountedPtr<soul::Structure>::decIfNotNull(TStack_38.structure.object);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x289d49);
    } while (bVar1);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2acfd0);
  }
  else {
    readValueType(&TStack_38,this);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::emplace_back<soul::Type>
              (__return_storage_ptr__,&TStack_38);
    RefCountedPtr<soul::Structure>::decIfNotNull(TStack_38.structure.object);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> readEventTypeList()
    {
        std::vector<Type> result;

        if (matchIf (HEARTOperator::openParen))
        {
            for (;;)
            {
                result.push_back (readValueType());

                if (! matchIf (HEARTOperator::comma))
                    break;
            }

            expect (HEARTOperator::closeParen);
        }
        else
        {
            result.push_back (readValueType());
        }

        return result;
    }